

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bar.cpp
# Opt level: O1

string_t duckdb::BarScalarFunction(double x,double min,double max,double max_width,string *result)

{
  pointer __src;
  anon_union_16_2_67f50693_for_value aVar1;
  bool bVar2;
  OutOfRangeException *pOVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double input;
  string local_80;
  double local_60;
  uint local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  double local_38;
  double local_30;
  
  local_60 = x;
  local_48 = max_width;
  local_38 = max;
  local_30 = min;
  if (BarScalarFunction(double,double,double,double,std::__cxx11::string&)::FULL_BLOCK == '\0') {
    BarScalarFunction();
  }
  if (BarScalarFunction(double,double,double,double,std::__cxx11::string&)::PARTIAL_BLOCKS == '\0')
  {
    BarScalarFunction();
  }
  bVar2 = Value::IsFinite<double>(local_48);
  if (!bVar2) {
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Max bar width must not be NaN or infinity","");
    OutOfRangeException::OutOfRangeException(pOVar3,&local_80);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_48 < 1.0) {
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Max bar width must be >= 1","");
    OutOfRangeException::OutOfRangeException(pOVar3,&local_80);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (local_48 <= 1000.0) {
    bVar2 = Value::IsNan<double>(local_60);
    input = 0.0;
    if (!bVar2) {
      bVar2 = Value::IsNan<double>(local_30);
      if (bVar2) {
        input = 0.0;
      }
      else {
        bVar2 = Value::IsNan<double>(local_38);
        input = 0.0;
        if ((local_30 < local_60 && !bVar2) && (input = local_48, local_60 < local_38)) {
          input = ((local_60 - local_30) * local_48) / (local_38 - local_30);
        }
      }
    }
    local_60 = input;
    bVar2 = Value::IsFinite<double>(input);
    if (bVar2) {
      result->_M_string_length = 0;
      *(result->_M_dataplus)._M_p = '\0';
      uVar6 = (ulong)(local_60 * 8.0);
      if ((uint)uVar6 < 8) {
        uVar7 = 0;
      }
      else {
        uVar7 = uVar6 >> 3 & 0x1fffffff;
        uVar5 = uVar7;
        do {
          ::std::__cxx11::string::append((char *)result);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      if ((uVar6 & 7) != 0) {
        uVar7 = uVar7 + 1;
        ::std::__cxx11::string::append((char *)result);
      }
      uVar6 = (long)(local_48 - 9.223372036854776e+18) & (long)local_48 >> 0x3f | (long)local_48;
      lVar4 = uVar6 - uVar7;
      if (uVar7 <= uVar6 && lVar4 != 0) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        ::std::__cxx11::string::_M_construct((ulong)&local_80,(char)lVar4);
        ::std::__cxx11::string::_M_append((char *)result,(ulong)local_80._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p);
        }
      }
      __src = (result->_M_dataplus)._M_p;
      local_58 = (uint)result->_M_string_length;
      if (local_58 < 0xd) {
        uStack_4c = 0;
        uStack_54 = 0;
        uStack_50 = 0;
        if (local_58 != 0) {
          switchD_012dd528::default(&uStack_54,__src,(ulong)(local_58 & 0xf));
        }
      }
      else {
        uStack_54 = *(undefined4 *)__src;
        uStack_50 = SUB84(__src,0);
        uStack_4c = (undefined4)((ulong)__src >> 0x20);
      }
      aVar1._4_1_ = (undefined1)uStack_54;
      aVar1._5_1_ = uStack_54._1_1_;
      aVar1._6_1_ = uStack_54._2_1_;
      aVar1._7_1_ = uStack_54._3_1_;
      aVar1.pointer.length = local_58;
      aVar1._8_4_ = uStack_50;
      aVar1._12_4_ = uStack_4c;
      return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar1.pointer;
    }
    pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Bar width must not be NaN or infinity","");
    OutOfRangeException::OutOfRangeException(pOVar3,&local_80);
    __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pOVar3 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"Max bar width must be <= 1000","");
  OutOfRangeException::OutOfRangeException(pOVar3,&local_80);
  __cxa_throw(pOVar3,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static string_t BarScalarFunction(double x, double min, double max, double max_width, string &result) {
	static const char *FULL_BLOCK = UnicodeBar::FullBlock();
	static const char *const *PARTIAL_BLOCKS = UnicodeBar::PartialBlocks();
	static const idx_t PARTIAL_BLOCKS_COUNT = UnicodeBar::PartialBlocksCount();

	if (!Value::IsFinite(max_width)) {
		throw OutOfRangeException("Max bar width must not be NaN or infinity");
	}
	if (max_width < 1) {
		throw OutOfRangeException("Max bar width must be >= 1");
	}
	if (max_width > 1000) {
		throw OutOfRangeException("Max bar width must be <= 1000");
	}

	double width;

	if (Value::IsNan(x) || Value::IsNan(min) || Value::IsNan(max) || x <= min) {
		width = 0;
	} else if (x >= max) {
		width = max_width;
	} else {
		width = max_width * (x - min) / (max - min);
	}

	if (!Value::IsFinite(width)) {
		throw OutOfRangeException("Bar width must not be NaN or infinity");
	}

	result.clear();
	idx_t used_blocks = 0;

	auto width_as_int = LossyNumericCast<uint32_t>(width * PARTIAL_BLOCKS_COUNT);
	idx_t full_blocks_count = (width_as_int / PARTIAL_BLOCKS_COUNT);
	for (idx_t i = 0; i < full_blocks_count; i++) {
		used_blocks++;
		result += FULL_BLOCK;
	}

	idx_t remaining = width_as_int % PARTIAL_BLOCKS_COUNT;

	if (remaining) {
		used_blocks++;
		result += PARTIAL_BLOCKS[remaining];
	}

	const idx_t integer_max_width = (idx_t)max_width;
	if (used_blocks < integer_max_width) {
		result += std::string(integer_max_width - used_blocks, ' ');
	}
	return string_t(result);
}